

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

Maybe<kj::Own<const_kj::File,_std::nullptr_t>_> __thiscall
kj::anon_unknown_9::DiskDirectory::tryOpenFile(DiskDirectory *this,PathPtr path,WriteMode mode)

{
  File *extraout_RDX;
  bool in_R8B;
  Maybe<kj::Own<const_kj::File,_std::nullptr_t>_> MVar1;
  PathPtr path_00;
  NullableValue<kj::OwnFd> local_30;
  Own<kj::File,_std::nullptr_t> local_28;
  
  path_00.parts.size_ = path.parts.size_;
  path_00.parts.ptr = &((path.parts.ptr)->content).size_;
  DiskHandle::tryOpenFileInternal((DiskHandle *)&local_30,path_00,mode,in_R8B);
  Maybe<kj::OwnFd>::map<kj::Own<kj::File,_std::nullptr_t>_(&)(kj::OwnFd)>
            ((Maybe<kj::OwnFd> *)&local_28,(_func_Own<kj::File,_std::nullptr_t>_OwnFd *)&local_30);
  (this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode =
       (_func_int **)local_28.disposer;
  *(File **)&this->super_DiskHandle = local_28.ptr;
  local_28.ptr = (File *)0x0;
  Own<kj::File,_std::nullptr_t>::dispose(&local_28);
  kj::_::NullableValue<kj::OwnFd>::~NullableValue(&local_30);
  MVar1.ptr.ptr = extraout_RDX;
  MVar1.ptr.disposer = (Disposer *)this;
  return (Maybe<kj::Own<const_kj::File,_std::nullptr_t>_>)MVar1.ptr;
}

Assistant:

Maybe<Own<const File>> tryOpenFile(PathPtr path, WriteMode mode) const override {
    return DiskHandle::tryOpenFile(path, mode);
  }